

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::BasicInputCase4::Run(BasicInputCase4 *this)

{
  CallLogWrapper *this_00;
  Vec4 *pVVar1;
  undefined8 in_RAX;
  long lVar2;
  GLuint i;
  GLuint index;
  GLbyte d [4];
  undefined8 local_28;
  
  this_00 = &(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  index = 0;
  local_28 = (undefined1 *)in_RAX;
  do {
    glu::CallLogWrapper::glVertexAttrib4f(this_00,index,0.0,0.0,0.0,0.0);
    index = index + 1;
  } while (index != 0x10);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x28,(void *)0x0,0x88e4);
  local_28 = (undefined1 *)CONCAT44(local_28._4_4_,0x7f817f81);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,4,&local_28);
  local_28 = (undefined1 *)0x4000300020001;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,4,8,&local_28);
  local_28 = &DAT_600000005;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0xc,8,&local_28);
  local_28 = (undefined1 *)CONCAT44(local_28._4_4_,0x817f817f);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x14,4,&local_28);
  local_28 = (undefined1 *)0xa000900080007;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x18,8,&local_28);
  local_28 = (undefined1 *)0xc0000000b;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x20,8,&local_28);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x38,(void *)0x0,0x88e4);
  local_28._0_6_ = CONCAT42(0x5a405640,(undefined2)local_28);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,6,&local_28);
  local_28 = (undefined1 *)CONCAT44(local_28._4_4_,0x5e405cb0);
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x1a,4,&local_28);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,4,0x1400,'\x01',0);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,1,4,0x1403,'\0',4);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,2,2,0x1405,'\0',0xc);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,5,2,0x140b,'\0',0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,1,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,5,6);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo[0],0,0x14);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,6,this->m_vbo[1],2,0x18);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,5);
  (this->super_BasicInputBase).expected_data[0].m_data[0] = -1.0;
  (this->super_BasicInputBase).expected_data[0].m_data[1] = 1.0;
  (this->super_BasicInputBase).expected_data[0].m_data[2] = -1.0;
  (this->super_BasicInputBase).expected_data[0].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[1].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[1].m_data[1] = 2.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[1].m_data[2] = 3.0;
  pVVar1[1].m_data[3] = 4.0;
  (this->super_BasicInputBase).expected_data[2].m_data[0] = 5.0;
  (this->super_BasicInputBase).expected_data[2].m_data[1] = 6.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[5].m_data[0] = 100.0;
  (this->super_BasicInputBase).expected_data[5].m_data[1] = 200.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[5].m_data[2] = 0.0;
  pVVar1[5].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0xf].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[0xf].m_data[1] = -1.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0xf].m_data[2] = 1.0;
  pVVar1[0xf].m_data[3] = -1.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[0] = 7.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[1] = 8.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x10].m_data[2] = 9.0;
  pVVar1[0x10].m_data[3] = 10.0;
  (this->super_BasicInputBase).expected_data[0x11].m_data[0] = 11.0;
  (this->super_BasicInputBase).expected_data[0x11].m_data[1] = 12.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x11].m_data[2] = 0.0;
  pVVar1[0x11].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x14].m_data[0] = 300.0;
  (this->super_BasicInputBase).expected_data[0x14].m_data[1] = 400.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x14].m_data[2] = 0.0;
  pVVar1[0x14].m_data[3] = 1.0;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, 20 * 2, NULL, GL_STATIC_DRAW);
		/* */
		{
			GLbyte d[] = { -127, 127, -127, 127 };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 1, 2, 3, 4 };
			glBufferSubData(GL_ARRAY_BUFFER, 4, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 5, 6 };
			glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(d), d);
		}
		/* */
		{
			GLbyte d[] = { 127, -127, 127, -127 };
			glBufferSubData(GL_ARRAY_BUFFER, 0 + 20, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 7, 8, 9, 10 };
			glBufferSubData(GL_ARRAY_BUFFER, 4 + 20, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 11, 12 };
			glBufferSubData(GL_ARRAY_BUFFER, 12 + 20, sizeof(d), d);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, 24 * 2 + 8, NULL, GL_STATIC_DRAW);
		/* */
		{
			GLhalf d[] = { FloatToHalf(0.0), FloatToHalf(100.0), FloatToHalf(200.0) };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		/* */
		{
			GLhalf d[] = { FloatToHalf(300.0), FloatToHalf(400.0) };
			glBufferSubData(GL_ARRAY_BUFFER, 26, sizeof(d), d);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 4, GL_BYTE, GL_TRUE, 0);
		glVertexAttribFormat(1, 4, GL_UNSIGNED_SHORT, GL_FALSE, 4);
		glVertexAttribFormat(2, 2, GL_UNSIGNED_INT, GL_FALSE, 12);
		glVertexAttribFormat(5, 2, GL_HALF_FLOAT, GL_FALSE, 0);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(1, 0);
		glVertexAttribBinding(2, 0);
		glVertexAttribBinding(5, 6);
		glBindVertexBuffer(0, m_vbo[0], 0, 20);
		glBindVertexBuffer(6, m_vbo[1], 2, 24);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(5);

		expected_data[0]	  = Vec4(-1.0f, 1.0f, -1.0f, 1.0f);
		expected_data[1]	  = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[2]	  = Vec4(5.0f, 6.0f, 0.0f, 1.0f);
		expected_data[5]	  = Vec4(100.0f, 200.0f, 0.0f, 1.0f);
		expected_data[0 + 15] = Vec4(1.0f, -1.0f, 1.0f, -1.0f);
		expected_data[1 + 15] = Vec4(7.0f, 8.0f, 9.0f, 10.0f);
		expected_data[2 + 15] = Vec4(11.0f, 12.0f, 0.0f, 1.0f);
		expected_data[5 + 15] = Vec4(300.0f, 400.0f, 0.0f, 1.0f);
		return BasicInputBase::Run();
	}